

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int stateCountModFour;
  int matrixIncr;
  int local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int j;
  double sum2B;
  double sum1B;
  double sum2A;
  double sum1A;
  double *matrices2Ptr;
  double *matrices1Ptr;
  int i;
  double oneOverScaleFactor;
  int k;
  double *destPtr;
  double *partials2Ptr;
  double *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  
  iVar7 = *(int *)(in_RDI + 0x24) + 1;
  iVar2 = *(int *)(in_RDI + 0x24);
  for (i = 0; i < *(int *)(in_RDI + 0x34); i = i + 1) {
    iVar3 = i * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x14) +
            *(int *)(in_RDI + 0x2c) * (int)partials2;
    iVar4 = i * *(int *)(in_RDI + 0x40);
    matrices2Ptr = (double *)(in_RDX + (long)iVar3 * 8);
    sum1A = (double)(in_R8 + (long)iVar3 * 8);
    sum2A = (double)(in_RSI + (long)iVar3 * 8);
    for (sum1B._4_4_ = (int)partials2; sum1B._4_4_ < (int)matrices1; sum1B._4_4_ = sum1B._4_4_ + 1)
    {
      dVar1 = matrices2[sum1B._4_4_];
      for (j = 0; j < *(int *)(in_RDI + 0x24); j = j + 1) {
        lVar5 = in_RCX + (long)iVar4 * 8 + (long)(j * iVar7) * 8;
        lVar6 = in_R9 + (long)iVar4 * 8 + (long)(j * iVar7) * 8;
        local_90 = 0.0;
        local_98 = 0.0;
        local_a0 = 0.0;
        local_a8 = 0.0;
        for (local_ac = 0; local_ac < iVar2 / 4 << 2; local_ac = local_ac + 4) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)(lVar5 + (long)local_ac * 8);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = matrices2Ptr[local_ac];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_90;
          auVar8 = vfmadd213sd_fma(auVar8,auVar18,auVar28);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(lVar6 + (long)local_ac * 8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)sum1A + (long)local_ac * 8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_98;
          auVar9 = vfmadd213sd_fma(auVar9,auVar19,auVar29);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(lVar5 + (long)(local_ac + 1) * 8);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = matrices2Ptr[local_ac + 1];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_a0;
          auVar10 = vfmadd213sd_fma(auVar10,auVar20,auVar30);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar6 + (long)(local_ac + 1) * 8);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)((long)sum1A + (long)(local_ac + 1) * 8);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_a8;
          auVar11 = vfmadd213sd_fma(auVar11,auVar21,auVar31);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar5 + (long)(local_ac + 2) * 8);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = matrices2Ptr[local_ac + 2];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = auVar8._0_8_;
          auVar8 = vfmadd213sd_fma(auVar12,auVar22,auVar32);
          local_90 = auVar8._0_8_;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(lVar6 + (long)(local_ac + 2) * 8);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)((long)sum1A + (long)(local_ac + 2) * 8);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = auVar9._0_8_;
          auVar8 = vfmadd213sd_fma(auVar13,auVar23,auVar33);
          local_98 = auVar8._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar5 + (long)(local_ac + 3) * 8);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices2Ptr[local_ac + 3];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar10._0_8_;
          auVar8 = vfmadd213sd_fma(auVar14,auVar24,auVar34);
          local_a0 = auVar8._0_8_;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(lVar6 + (long)(local_ac + 3) * 8);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = *(ulong *)((long)sum1A + (long)(local_ac + 3) * 8);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = auVar11._0_8_;
          auVar8 = vfmadd213sd_fma(auVar15,auVar25,auVar35);
          local_a8 = auVar8._0_8_;
        }
        for (; local_ac < *(int *)(in_RDI + 0x24); local_ac = local_ac + 1) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(lVar5 + (long)local_ac * 8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = matrices2Ptr[local_ac];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_90;
          auVar8 = vfmadd213sd_fma(auVar16,auVar26,auVar36);
          local_90 = auVar8._0_8_;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(lVar6 + (long)local_ac * 8);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)((long)sum1A + (long)local_ac * 8);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_98;
          auVar8 = vfmadd213sd_fma(auVar17,auVar27,auVar37);
          local_98 = auVar8._0_8_;
        }
        *(double *)sum2A = (local_90 + local_a0) * (local_98 + local_a8) * (1.0 / dVar1);
        sum2A = (double)((long)sum2A + 8);
      }
      matrices2Ptr = matrices2Ptr + *(int *)(in_RDI + 0x2c);
      sum1A = (double)((long)sum1A + (long)*(int *)(in_RDI + 0x2c) * 8);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}